

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_chan.c
# Opt level: O2

int s_chan_get(s_awaiter_t *__awaiter_dummy__,s_chan_t *chan,void *out_object)

{
  int iVar1;
  
  iVar1 = s_chan_get_n(__awaiter_dummy__,chan,out_object,1);
  return iVar1;
}

Assistant:

int s_chan_get(__async__, s_chan_t *chan, void *out_object) {
#if 1
    return s_chan_get_n(__await__, chan, out_object, 1);
#else
    while (chan->available_count <= 0) {
        int ret = s_event_wait(__await__, &chan->event);
        if(ret != 0) return ret;
    }

    memcpy(out_object, (char*)&chan[1] + chan->begin * (size_t)chan->element_size, chan->element_size);

    ++chan->begin;
    while (chan->begin > chan->max_count)
        chan->begin -= chan->max_count;
    --chan->available_count;

    s_event_set(&chan->event);
    return 0;
#endif
}